

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramStateReattachShaderCase::executeForProgram
          (ProgramStateReattachShaderCase *this,Program *program,ShaderAllocator *shaders)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  Shader *pSVar2;
  char *__s;
  allocator<char> local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [384];
  
  pTVar1 = ((this->super_ProgramStateCase).super_ApiCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  pSVar2 = Functional::anon_unknown_0::ShaderAllocator::get
                     (shaders,(this->super_ProgramStateCase).m_shaderType);
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  __s = glu::getShaderTypeName((this->super_ProgramStateCase).m_shaderType);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,__s,&local_209);
  std::operator+(&local_1e8,"Reattaching ",&local_208);
  std::operator+(&local_1c8,&local_1e8," shader");
  std::operator<<((ostream *)this_00,(string *)&local_1c8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  glu::Program::detachShader(program,pSVar2->m_shader);
  glu::Program::attachShader(program,pSVar2->m_shader);
  return;
}

Assistant:

void executeForProgram (glu::Program& program, ShaderAllocator& shaders)
	{
		TestLog&		log			= m_testCtx.getLog();
		glu::Shader&	caseShader	= shaders.get(m_shaderType);

		log << TestLog::Message << "Reattaching " + std::string(getShaderTypeName(m_shaderType)) + " shader" << TestLog::EndMessage;
		program.detachShader(caseShader.getShader());
		program.attachShader(caseShader.getShader());
	}